

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,ScopedMessage *other)

{
  std::__cxx11::string::string((string *)this,(string *)other);
  SourceLineInfo::SourceLineInfo(&(this->m_info).lineInfo,&(other->m_info).lineInfo);
  (this->m_info).type = (other->m_info).type;
  std::__cxx11::string::string((string *)&(this->m_info).message,(string *)&(other->m_info).message)
  ;
  (this->m_info).sequence = (other->m_info).sequence;
  return;
}

Assistant:

ScopedMessage::ScopedMessage( ScopedMessage const& other )
    : m_info( other.m_info )
    {}